

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

void __thiscall
OpenMD::SelectionEvaluator::instructionDispatchLoop
          (SelectionEvaluator *this,SelectionSet *bs,int frame)

{
  pointer pvVar1;
  Token *pTVar2;
  fd_set *__writefds;
  fd_set *in_R8;
  timeval *in_R9;
  Token token;
  
  do {
    __writefds = (fd_set *)(ulong)this->pc;
    pvVar1 = (this->aatoken).
             super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((fd_set *)
        (((long)(this->aatoken).
                super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= __writefds) {
      return;
    }
    this->pc = this->pc + 1;
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=
              (&this->statement,pvVar1 + (long)__writefds);
    pTVar2 = (this->statement).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->statementLength =
         (int)(((long)(this->statement).
                      super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pTVar2) / 0x18);
    Token::Token(&token,pTVar2);
    if (token.tok == 0x302) {
      select(this,(int)bs,(fd_set *)(ulong)(uint)frame,__writefds,in_R8,in_R9);
    }
    else {
      if (token.tok != 0x301) {
        unrecognizedCommand(this,&token);
        std::any::reset(&token.value);
        return;
      }
      define(this);
    }
    std::any::reset(&token.value);
  } while( true );
}

Assistant:

void SelectionEvaluator::instructionDispatchLoop(SelectionSet& bs,
                                                   int frame) {
    while (pc < aatoken.size()) {
      statement       = aatoken[pc++];
      statementLength = statement.size();
      Token token     = statement[0];
      switch (token.tok) {
      case Token::define:
        define();
        break;
      case Token::select:
        select(bs, frame);
        break;
      default:
        unrecognizedCommand(token);
        return;
      }
    }
  }